

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O2

int hdr_log_decode(hdr_histogram **histogram,char *base64_histogram,size_t base64_len)

{
  int iVar1;
  size_t __size;
  uint8_t *output;
  
  __size = hdr_base64_decoded_len(base64_len);
  output = (uint8_t *)calloc(1,__size);
  iVar1 = hdr_base64_decode(base64_histogram,base64_len,output,__size);
  if (iVar1 == 0) {
    iVar1 = hdr_decode_compressed(output,__size,histogram);
  }
  free(output);
  return iVar1;
}

Assistant:

int hdr_log_decode(struct hdr_histogram** histogram, char* base64_histogram, size_t base64_len)
{
    int r;
    uint8_t* compressed_histogram = NULL;
    int result = 0;

    size_t compressed_len = hdr_base64_decoded_len(base64_len);
    compressed_histogram = (uint8_t*) hdr_malloc(sizeof(uint8_t)*compressed_len);
    memset(compressed_histogram, 0, compressed_len);

    r = hdr_base64_decode(
        base64_histogram, base64_len, compressed_histogram, compressed_len);

    if (r != 0)
    {
        FAIL_AND_CLEANUP(cleanup, result, r);
    }

    r = hdr_decode_compressed(compressed_histogram, compressed_len, histogram);
    if (r != 0)
    {
        FAIL_AND_CLEANUP(cleanup, result, r);
    }

cleanup:
    hdr_free(compressed_histogram);

    return result;
}